

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O3

bool __thiscall mahjong::Meld::isMultiWait(Meld *this,Tile last_tile)

{
  bool bVar1;
  Tile *tile;
  IsTerminal *this_00;
  IsTerminal local_11;
  IsSame local_10;
  IsTerminal local_f;
  IsSame local_e;
  IsSame local_d;
  Tile local_c;
  
  if ((this->is_open == false) &&
     (local_c = last_tile,
     bVar1 = IsSame::operator()(&local_d,(this->tiles).
                                         super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                (this->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -1), !bVar1)) {
    bVar1 = IsSame::operator()(&local_e,(this->tiles).
                                        super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                                        ._M_impl.super__Vector_impl_data._M_start,&local_c);
    if (bVar1) {
      tile = (this->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl
             .super__Vector_impl_data._M_finish + -1;
      this_00 = &local_f;
    }
    else {
      bVar1 = IsSame::operator()(&local_10,
                                 (this->tiles).
                                 super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -1,&local_c);
      if (!bVar1) {
        return false;
      }
      tile = (this->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl
             .super__Vector_impl_data._M_start;
      this_00 = &local_11;
    }
    bVar1 = IsTerminal::operator()(this_00,tile);
    return !bVar1;
  }
  return false;
}

Assistant:

bool Meld::isMultiWait(Tile last_tile) const
{
	if (is_open) return false;
	if (isTripletOrQuad()) return false;

	if (IsSame()(tiles.front(), last_tile))
	{
		return !IsTerminal()(tiles.back());
	}

	if (IsSame()(tiles.back(), last_tile))
	{
		return !IsTerminal()(tiles.front());
	}

	return false;
}